

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<char>::resizeRealloc<slang::SmallVectorBase<char>::ValueInitTag>
          (SmallVectorBase<char> *this,size_type newSize,ValueInitTag *val)

{
  pointer __dest;
  ulong uVar1;
  EVP_PKEY_CTX *ctx;
  ulong capacity;
  
  if (newSize <= this->len) {
    assert::assertFailed
              ("newSize > len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x337,
               "void slang::SmallVectorBase<char>::resizeRealloc(size_type, const TVal &) [T = char, TVal = slang::SmallVectorBase<char>::ValueInitTag]"
              );
  }
  if (-1 < (long)newSize) {
    uVar1 = this->cap;
    capacity = uVar1 * 2;
    if (uVar1 * 2 <= newSize) {
      capacity = newSize;
    }
    if (0x7fffffffffffffff - uVar1 < uVar1) {
      capacity = 0x7fffffffffffffff;
    }
    ctx = (EVP_PKEY_CTX *)0x1;
    __dest = (pointer)detail::allocArray(capacity,1);
    if (this->len == 0) {
      uVar1 = 0;
    }
    else {
      ctx = (EVP_PKEY_CTX *)this->data_;
      memmove(__dest,ctx,this->len);
      uVar1 = this->len;
    }
    if (uVar1 != newSize) {
      __dest[uVar1] = '\0';
      if (~uVar1 + newSize != 0) {
        ctx = (EVP_PKEY_CTX *)0x0;
        memset(__dest + uVar1 + 1,0,~uVar1 + newSize);
      }
    }
    cleanup(this,ctx);
    this->len = newSize;
    this->cap = capacity;
    this->data_ = __dest;
    return;
  }
  detail::throwLengthError();
}

Assistant:

void SmallVectorBase<T>::resizeRealloc(size_type newSize, const TVal& val) {
    ASSERT(newSize > len);
    if (newSize > max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(newSize);
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    std::uninitialized_move(begin(), end(), newData);

    if constexpr (std::is_same_v<T, TVal>) {
        std::uninitialized_fill_n(newData + len, newSize - len, val);
    }
    else {
        std::uninitialized_value_construct_n(newData + len, newSize - len);
    }

    cleanup();
    len = newSize;
    cap = newCap;
    data_ = newData;
}